

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockArrayStrideContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  NodeType NVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  TestNode *pTVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  deInt32 *pdVar7;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr layout;
  ProgramResourceQueryTestTarget local_60;
  SharedPtr local_58;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_60,PROGRAMINTERFACE_UNIFORM,4);
  pNVar2 = parentStructure->m_ptr;
  NVar1 = pNVar2->m_type;
  if ((NVar1 == TYPE_INTERFACE_BLOCK) &&
     ((*(char *)&pNVar2[1]._vptr_Node != '\x01' ||
      (((pNVar2->m_enclosingNode).m_ptr)->m_type == TYPE_ARRAY_ELEMENT)))) {
    generateVariableCases(context,parentStructure,targetGroup,&local_60,1,true);
    generateVariableArrayCases(context,parentStructure,targetGroup,&local_60,1);
    generateCompoundVariableCases(context,parentStructure,targetGroup,&local_60,1);
  }
  else {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar4);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar4,&local_60,2,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar4,&local_60,2,false);
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar4);
    if (NVar1 != TYPE_INTERFACE_BLOCK) {
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,parentStructure,(TestCaseGroup *)pTVar4,local_60.interface,TYPE_SAMPLER_2D,
                 1,false);
      pNVar5 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_44,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar2 = parentStructure->m_ptr;
      pSVar3 = parentStructure->m_state;
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar5->m_enclosingNode).m_ptr = pNVar2;
      (pNVar5->m_enclosingNode).m_state = pSVar3;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
      pNVar5[1]._vptr_Node = local_44[0];
      *(_func_int ***)&pNVar5[1].m_type = local_44[1];
      *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_34;
      local_58.m_state = (SharedPtrStateBase *)0x0;
      local_58.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_58.m_state = pSVar6;
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,&local_58,(TestCaseGroup *)pTVar4,local_60.interface,
                 TYPE_UINT_ATOMIC_COUNTER,1,false);
      pSVar3 = local_58.m_state;
      pdVar7 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
      }
      LOCK();
      pdVar7 = &pSVar3->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if ((*pdVar7 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar4,local_60.interface,TYPE_FLOAT,2,false
              );
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar4,local_60.interface,TYPE_BOOL,1,false)
    ;
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar4,local_60.interface,TYPE_BOOL_VEC3,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar4,local_60.interface,TYPE_FLOAT_VEC3,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar4,local_60.interface,TYPE_INT_VEC3,2,
               false);
  }
  return;
}

Assistant:

static void generateUniformBlockArrayStrideContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ARRAY_STRIDE);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 2, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 2, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .sampler_2d_*
			if (!isInterfaceBlock)
				generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_SAMPLER_2D, 1, false);

			// .atomic_counter_*
			if (!isInterfaceBlock)
			{
				const ResourceDefinition::Node::SharedPtr layout(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
				generateBufferBackedArrayStrideTypeAggregateCases(context, layout, blockGroup, queryTarget.interface, glu::TYPE_UINT_ATOMIC_COUNTER, 1, false);
			}

			// .float_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT, 2, false);

			// .bool_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL, 1, false);

			// .bvec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL_VEC3, 2, false);

			// .vec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT_VEC3, 2, false);

			// .ivec2_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_INT_VEC3, 2, false);
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}